

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CDirectiveArea.cpp
# Opt level: O0

bool __thiscall CDirectiveAutoRegion::Validate(CDirectiveAutoRegion *this,ValidateState *state)

{
  bool bVar1;
  int iVar2;
  int64_t iVar3;
  pointer pCVar4;
  Architecture *pAVar5;
  long *args;
  bool local_59;
  long *plStack_58;
  bool result;
  int64_t maxRange;
  int64_t minRange;
  int64_t oldContentSize;
  int64_t oldPosition;
  ValidateState contentValidation;
  ValidateState *state_local;
  CDirectiveAutoRegion *this_local;
  
  contentValidation._16_8_ = state;
  iVar3 = FileManager::getVirtualAddress(g_fileManager);
  this->resetPosition = iVar3;
  contentValidation.noFileChangeDirective = *(char **)(contentValidation._16_8_ + 0x10);
  oldPosition = CONCAT71((int7)((ulong)*(undefined8 *)contentValidation._16_8_ >> 8),1);
  contentValidation._0_8_ = (long)".region" + 1;
  if (*(int *)(contentValidation._16_8_ + 0x10) < 1) {
    iVar3 = FileManager::getVirtualAddress(g_fileManager);
    this->position = iVar3;
    pCVar4 = std::unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>::operator->
                       (&this->content);
    CAssemblerCommand::applyFileInfo(pCVar4);
    pCVar4 = std::unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>::operator->
                       (&this->content);
    (*pCVar4->_vptr_CAssemblerCommand[2])(pCVar4,&oldPosition);
    iVar3 = FileManager::getVirtualAddress(g_fileManager);
    this->contentSize = iVar3 - this->position;
    FileManager::seekVirtual(g_fileManager,this->resetPosition);
    this_local._7_1_ = true;
  }
  else {
    oldContentSize = this->position;
    minRange = this->contentSize;
    maxRange = -1;
    plStack_58 = (long *)0xffffffffffffffff;
    bVar1 = Expression::isLoaded(&this->minRangeExpression);
    if ((!bVar1) ||
       (bVar1 = Expression::evaluateInteger<long>(&this->minRangeExpression,&maxRange), bVar1)) {
      bVar1 = Expression::isLoaded(&this->maxRangeExpression);
      if ((!bVar1) ||
         (bVar1 = Expression::evaluateInteger<long>
                            (&this->maxRangeExpression,(long *)&stack0xffffffffffffffa8), bVar1)) {
        iVar3 = FileManager::getOpenFileID(g_fileManager);
        this->fileID = iVar3;
        args = plStack_58;
        bVar1 = Allocations::allocateSubArea
                          (this->fileID,&this->position,maxRange,(int64_t)plStack_58,
                           this->contentSize);
        if (bVar1) {
          pAVar5 = Architecture::current();
          (*pAVar5->_vptr_Architecture[3])();
          FileManager::seekVirtual(g_fileManager,this->position);
          pCVar4 = std::unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>::
                   operator->(&this->content);
          CAssemblerCommand::applyFileInfo(pCVar4);
          pCVar4 = std::unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>::
                   operator->(&this->content);
          iVar2 = (*pCVar4->_vptr_CAssemblerCommand[2])(pCVar4,&oldPosition);
          local_59 = (bool)((byte)iVar2 & 1);
          iVar3 = FileManager::getVirtualAddress(g_fileManager);
          this->contentSize = iVar3 - this->position;
          CAssemblerCommand::applyFileInfo(&this->super_CAssemblerCommand);
          FileManager::seekVirtual(g_fileManager,this->resetPosition);
          if ((this->position != oldContentSize) || (this->contentSize != minRange)) {
            local_59 = true;
          }
          this_local._7_1_ = local_59;
        }
        else {
          Logger::queueError<long>((Logger *)0x1,0x22ccb5,(char *)&this->contentSize,args);
          this_local._7_1_ = Allocations::canTrimSpace();
        }
      }
      else {
        Logger::queueError<>(Error,"Invalid range expression for .autoregion");
        this_local._7_1_ = false;
      }
    }
    else {
      Logger::queueError<>(Error,"Invalid range expression for .autoregion");
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool CDirectiveAutoRegion::Validate(const ValidateState &state)
{
	resetPosition = g_fileManager->getVirtualAddress();

	ValidateState contentValidation = state;
	contentValidation.noFileChange = true;
	contentValidation.noFileChangeDirective = "region";

	// We need at least one full pass run before we can get an address.
	if (state.passes < 1)
	{
		// Just calculate contentSize.
		position = g_fileManager->getVirtualAddress();
		content->applyFileInfo();
		content->Validate(contentValidation);
		contentSize = g_fileManager->getVirtualAddress() - position;

		g_fileManager->seekVirtual(resetPosition);
		return true;
	}

	int64_t oldPosition = position;
	int64_t oldContentSize = contentSize;

	int64_t minRange = -1;
	int64_t maxRange = -1;
	if (minRangeExpression.isLoaded())
	{
		if (!minRangeExpression.evaluateInteger(minRange))
		{
			Logger::queueError(Logger::Error, "Invalid range expression for .autoregion");
			return false;
		}
	}
	if (maxRangeExpression.isLoaded())
	{
		if (!maxRangeExpression.evaluateInteger(maxRange))
		{
			Logger::queueError(Logger::Error, "Invalid range expression for .autoregion");
			return false;
		}
	}

	fileID = g_fileManager->getOpenFileID();
	if (!Allocations::allocateSubArea(fileID, position, minRange, maxRange, contentSize))
	{
		Logger::queueError(Logger::Error, "No space available for .autoregion of size %d", contentSize);
		// We might be able to do better next time.
		return Allocations::canTrimSpace();
	}

	Architecture::current().NextSection();
	g_fileManager->seekVirtual(position);

	content->applyFileInfo();
	bool result = content->Validate(contentValidation);
	contentSize = g_fileManager->getVirtualAddress() - position;

	// restore info of this command
	applyFileInfo();
	g_fileManager->seekVirtual(resetPosition);

	if (position != oldPosition || contentSize != oldContentSize)
		result = true;

	return result;
}